

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O3

CURLcode httpauth(Curl_easy *data,_Bool proxy,unsigned_long auth)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (auth == 0) {
    uVar2 = 0;
  }
  else {
    (&(data->state).authhost)[proxy].field_0x18 =
         (&(data->state).authhost)[proxy].field_0x18 & 0xfb | (byte)((auth & 0xffffffff) >> 2) & 4;
    uVar2 = auth & 0xffffffffffffffeb | (ulong)((uint)(auth >> 3) & 2);
    uVar3 = 0;
    do {
      if (uVar3 == 0x1f) {
        return CURLE_NOT_BUILT_IN;
      }
      uVar1 = uVar3 & 0x3f;
      uVar3 = uVar3 + 1;
    } while ((uVar2 >> uVar1 & 1) == 0);
  }
  (&(data->set).httpauth)[proxy] = uVar2;
  return CURLE_OK;
}

Assistant:

static CURLcode httpauth(struct Curl_easy *data, bool proxy,
                         unsigned long auth)
{
  if(auth != CURLAUTH_NONE) {
    int bitcheck = 0;
    bool authbits = FALSE;
    /* the DIGEST_IE bit is only used to set a special marker, for all the
       rest we need to handle it as normal DIGEST */
    bool iestyle = !!(auth & CURLAUTH_DIGEST_IE);
    if(proxy)
      data->state.authproxy.iestyle = iestyle;
    else
      data->state.authhost.iestyle = iestyle;

    if(auth & CURLAUTH_DIGEST_IE) {
      auth |= CURLAUTH_DIGEST; /* set standard digest bit */
      auth &= ~CURLAUTH_DIGEST_IE; /* unset ie digest bit */
    }

    /* switch off bits we cannot support */
#ifndef USE_NTLM
    auth &= ~CURLAUTH_NTLM;    /* no NTLM support */
#endif
#ifndef USE_SPNEGO
    auth &= ~CURLAUTH_NEGOTIATE; /* no Negotiate (SPNEGO) auth without GSS-API
                                    or SSPI */
#endif

    /* check if any auth bit lower than CURLAUTH_ONLY is still set */
    while(bitcheck < 31) {
      if(auth & (1UL << bitcheck++)) {
        authbits = TRUE;
        break;
      }
    }
    if(!authbits)
      return CURLE_NOT_BUILT_IN; /* no supported types left! */
  }
  if(proxy)
    data->set.proxyauth = auth;
  else
    data->set.httpauth = auth;
  return CURLE_OK;
}